

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

NumericExpr __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
::ReadNumericExpr(NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                  *this,char code,bool ignore_zero)

{
  int iVar1;
  int num_args;
  Expr arg;
  Reference RVar2;
  NumericExpr NVar3;
  NumericExpr NVar4;
  undefined7 in_register_00000031;
  bool bVar5;
  double value;
  CallArgHandler CVar6;
  BasicIteratedExprBuilder<mp::CallExpr> local_30;
  
  iVar1 = (int)CONCAT71(in_register_00000031,code);
  switch(iVar1) {
  case 0x6c:
  case 0x6e:
  case 0x73:
    value = ReadConstant(this,code);
    if (value != 0.0 || !ignore_zero) {
      NVar4 = NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnNumber
                        (this->handler_,value);
      return (NumericExpr)NVar4.super_ExprBase.impl_;
    }
    break;
  case 0x6f:
    iVar1 = ReadOpCode(this);
    NVar3 = ReadNumericExpr(this,iVar1);
    return (NumericExpr)NVar3.super_ExprBase.impl_;
  case 0x76:
    RVar2 = DoReadReference(this);
    return (NumericExpr)
           RVar2.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_;
  default:
    if (iVar1 == 0x66) {
      iVar1 = ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_funcs);
      num_args = BinaryReader<mp::internal::IdentityConverter>::ReadUInt(this->reader_);
      CVar6 = NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::BeginCall
                        (this->handler_,iVar1,num_args);
      local_30.impl_ = CVar6.impl_;
      local_30.arg_index_ = CVar6.arg_index_;
      iVar1 = 0;
      if (0 < num_args) {
        iVar1 = num_args;
      }
      while (bVar5 = iVar1 != 0, iVar1 = iVar1 + -1, bVar5) {
        arg = ReadSymbolicExpr(this);
        BasicExprFactory<std::allocator<char>_>::BasicIteratedExprBuilder<mp::CallExpr>::AddArg
                  (&local_30,(Arg)arg.super_ExprBase.impl_);
      }
      CVar6.arg_index_ = local_30.arg_index_;
      CVar6.impl_ = local_30.impl_;
      CVar6._12_4_ = 0;
      NVar4 = NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::EndCall
                        (this->handler_,CVar6);
      return (NumericExpr)(Impl *)NVar4.super_ExprBase.impl_;
    }
  case 0x6d:
  case 0x70:
  case 0x71:
  case 0x72:
  case 0x74:
  case 0x75:
    BinaryReaderBase::ReportError<>(&this->reader_->super_BinaryReaderBase,(CStringRef)0x15a4f1);
  }
  return (NumericExpr)(Impl *)0x0;
}

Assistant:

typename Handler::NumericExpr
    NLReader<Reader, Handler>::ReadNumericExpr(char code, bool ignore_zero) {
  switch (code) {
  case 'f': {
    // Read a function call.
    int func_index = ReadUInt(header_.num_funcs);
    int num_args = reader_.ReadUInt();
    reader_.ReadTillEndOfLine();
    typename Handler::CallArgHandler args =
        handler_.BeginCall(func_index, num_args);
    for (int i = 0; i < num_args; ++i)
      args.AddArg(ReadSymbolicExpr());
    return handler_.EndCall(args);
  }
  case 'n': case 'l': case 's': {
    // Read a number.
    double value = ReadConstant(code);
    if (ignore_zero && value == 0)
      break;  // Ignore zero constant.
    return handler_.OnNumber(value);
  }
  case 'o':
    return ReadNumericExpr(ReadOpCode());
  case 'v':
    return DoReadReference();
  default:
    reader_.ReportError("expected expression");
  }
  return NumericExpr();
}